

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool ContextualCheckBlock
               (CBlock *block,BlockValidationState *state,ChainstateManager *chainman,
               CBlockIndex *pindexPrev)

{
  uint uVar1;
  long lVar2;
  pointer psVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  byte bVar7;
  ulong nBlockTime;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  const_iterator __first2;
  pointer psVar11;
  uint nBlockHeight;
  undefined8 __first1;
  long in_FS_OFFSET;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [32];
  CScript expect;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
    nBlockHeight = 0;
  }
  else {
    nBlockHeight = pindexPrev->nHeight + 1;
  }
  bVar6 = DeploymentActiveAfter<Consensus::BuriedDeployment>(pindexPrev,chainman,DEPLOYMENT_CSV);
  if (bVar6) {
    if (pindexPrev == (CBlockIndex *)0x0) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x107a,
                    "bool ContextualCheckBlock(const CBlock &, BlockValidationState &, const ChainstateManager &, const CBlockIndex *)"
                   );
    }
    nBlockTime = CBlockIndex::GetMedianTimePast(pindexPrev);
  }
  else {
    nBlockTime = (ulong)(block->super_CBlockHeader).nTime;
  }
  psVar11 = (block->vtx).
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar11 == psVar3) {
      bVar6 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                        (pindexPrev,chainman,DEPLOYMENT_HEIGHTINCB);
      if (bVar6) {
        local_78._16_8_ = 0;
        local_78._24_8_ = 0;
        local_78._0_8_ = (TransactionSerParams *)0x0;
        local_78._8_8_ = (CBlock *)0x0;
        other = &CScript::push_int64((CScript *)local_78,(long)(int)nBlockHeight)->super_CScriptBase
        ;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&expect.super_CScriptBase,other)
        ;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
        lVar4 = *(long *)&((((block->vtx).
                             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->vin;
        uVar1 = *(uint *)(lVar4 + 0x44);
        uVar5 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar5 = uVar1;
        }
        uVar10 = expect.super_CScriptBase._size - 0x1d;
        if (expect.super_CScriptBase._size < 0x1d) {
          uVar10 = expect.super_CScriptBase._size;
        }
        if (uVar5 < uVar10) {
LAB_008b94c3:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_78,"bad-cb-height",&local_99);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"block height mismatch in coinbase",&local_9a);
          bVar6 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                             (string *)local_78,&local_98);
          nBlockHeight = (uint)bVar6;
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)local_78);
          bVar6 = false;
        }
        else {
          __first1 = &expect.super_CScriptBase;
          if (0x1c < expect.super_CScriptBase._size) {
            __first1 = expect.super_CScriptBase._union.indirect_contents.indirect;
          }
          if (uVar1 < 0x1d) {
            __first2.ptr = (uchar *)(lVar4 + 0x28);
          }
          else {
            __first2.ptr = *(uchar **)(lVar4 + 0x28);
          }
          bVar6 = std::__equal<false>::
                  equal<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::const_iterator>
                            ((iterator)__first1,(uchar *)(__first1 + (long)(int)uVar10),__first2);
          if (!bVar6) goto LAB_008b94c3;
          bVar6 = true;
        }
        bVar7 = (byte)nBlockHeight;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&expect.super_CScriptBase);
        if (!bVar6) goto LAB_008b95e7;
      }
      bVar6 = DeploymentActiveAfter<Consensus::BuriedDeployment>
                        (pindexPrev,chainman,DEPLOYMENT_SEGWIT);
      bVar6 = CheckWitnessMalleation(block,bVar6,state);
      if (!bVar6) {
        bVar7 = 0;
        goto LAB_008b95e7;
      }
      expect.super_CScriptBase._union.indirect_contents.indirect = "";
      expect.super_CScriptBase._union._8_8_ = block;
      sVar8 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                        ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&expect);
      local_78._0_8_ = &TX_WITH_WITNESS;
      local_78._8_8_ = block;
      sVar9 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                        ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)local_78);
      bVar7 = 1;
      if ((long)(sVar9 + sVar8 * 3) < 0x3d0901) goto LAB_008b95e7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&expect,"bad-blk-weight",(allocator<char> *)&local_98);
      tinyformat::format<char[21]>
                ((string *)local_78,"%s : weight limit failed",(char (*) [21])"ContextualCheckBlock"
                );
      bVar7 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)&expect,(string *)local_78);
      goto LAB_008b9401;
    }
    bVar6 = IsFinalTx((psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,nBlockHeight,nBlockTime);
    psVar11 = psVar11 + 1;
  } while (bVar6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expect,"bad-txns-nonfinal",(allocator<char> *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"non-final transaction",&local_99);
  bVar7 = ValidationState<BlockValidationResult>::Invalid
                    (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                     (string *)&expect,(string *)local_78);
LAB_008b9401:
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)&expect);
LAB_008b95e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (bool)(bVar7 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool ContextualCheckBlock(const CBlock& block, BlockValidationState& state, const ChainstateManager& chainman, const CBlockIndex* pindexPrev)
{
    const int nHeight = pindexPrev == nullptr ? 0 : pindexPrev->nHeight + 1;

    // Enforce BIP113 (Median Time Past).
    bool enforce_locktime_median_time_past{false};
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CSV)) {
        assert(pindexPrev != nullptr);
        enforce_locktime_median_time_past = true;
    }

    const int64_t nLockTimeCutoff{enforce_locktime_median_time_past ?
                                      pindexPrev->GetMedianTimePast() :
                                      block.GetBlockTime()};

    // Check that all transactions are finalized
    for (const auto& tx : block.vtx) {
        if (!IsFinalTx(*tx, nHeight, nLockTimeCutoff)) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal", "non-final transaction");
        }
    }

    // Enforce rule that the coinbase starts with serialized block height
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB))
    {
        CScript expect = CScript() << nHeight;
        if (block.vtx[0]->vin[0].scriptSig.size() < expect.size() ||
            !std::equal(expect.begin(), expect.end(), block.vtx[0]->vin[0].scriptSig.begin())) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-height", "block height mismatch in coinbase");
        }
    }

    // Validation for witness commitments.
    // * We compute the witness hash (which is the hash including witnesses) of all the block's transactions, except the
    //   coinbase (where 0x0000....0000 is used instead).
    // * The coinbase scriptWitness is a stack of a single 32-byte vector, containing a witness reserved value (unconstrained).
    // * We build a merkle tree with all those witness hashes as leaves (similar to the hashMerkleRoot in the block header).
    // * There must be at least one output whose scriptPubKey is a single 36-byte push, the first 4 bytes of which are
    //   {0xaa, 0x21, 0xa9, 0xed}, and the following 32 bytes are SHA256^2(witness root, witness reserved value). In case there are
    //   multiple, the last one is used.
    if (!CheckWitnessMalleation(block, DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT), state)) {
        return false;
    }

    // After the coinbase witness reserved value and commitment are verified,
    // we can check if the block weight passes (before we've checked the
    // coinbase witness, it would be possible for the weight to be too
    // large by filling up the coinbase witness, which doesn't change
    // the block hash, so we couldn't mark the block as permanently
    // failed).
    if (GetBlockWeight(block) > MAX_BLOCK_WEIGHT) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-weight", strprintf("%s : weight limit failed", __func__));
    }

    return true;
}